

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O2

GenericArray * __thiscall avro::GenericArray::operator=(GenericArray *this,GenericArray *param_1)

{
  boost::shared_ptr<avro::Node>::operator=
            ((shared_ptr<avro::Node> *)this,(shared_ptr<avro::Node> *)param_1);
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::operator=
            (&this->value_,&param_1->value_);
  return this;
}

Assistant:

class AVRO_DECL GenericArray : public GenericContainer {
public:
    /**
     * The contents type for the array.
     */
    typedef std::vector<GenericDatum> Value;

    /**
     * Constructs a generic array corresponding to the given schema \p schema,
     * which should be of Avro type array.
     */
    GenericArray(const NodePtr& schema) : GenericContainer(AVRO_ARRAY, schema) {
    }

    /**
     * Returns the contents of this array.
     */
    const Value& value() const {
        return value_;
    }

    /**
     * Returns the reference to the contents of this array.
     */
    Value& value() {
        return value_;
    }
private:
    Value value_;
}